

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_RepeatedFieldSetOptimizationTest_Test::
TestBody(MessageDifferencerTest_RepeatedFieldSetOptimizationTest_Test *this)

{
  bool bVar1;
  void *pvVar2;
  void *pvVar3;
  FieldDescriptor *pFVar4;
  RepeatedField<int> *this_00;
  int i;
  int value;
  char *in_R9;
  pointer *__ptr;
  Metadata MVar5;
  string_view name;
  string_view name_00;
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  MessageDifferencer differencer;
  AssertHelper local_380;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_378;
  internal local_370 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_368;
  string local_360;
  undefined1 local_340 [184];
  undefined1 local_288 [184];
  MessageDifferencer local_1d0;
  
  util::MessageDifferencer::MessageDifferencer(&local_1d0);
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_288,(Arena *)0x0);
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_340,(Arena *)0x0);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_288 + 0x30),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  pvVar3 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_340 + 0x30),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  MVar5 = proto2_unittest::TestDiffMessage_Item::GetMetadata
                    ((TestDiffMessage_Item *)
                     proto2_unittest::_TestDiffMessage_Item_default_instance_);
  name._M_str = "ra";
  name._M_len = 2;
  pFVar4 = Descriptor::FindFieldByName(MVar5.descriptor,name);
  util::MessageDifferencer::TreatAsSet(&local_1d0,pFVar4);
  MVar5 = proto2_unittest::TestDiffMessage_Item::GetMetadata
                    ((TestDiffMessage_Item *)
                     proto2_unittest::_TestDiffMessage_Item_default_instance_);
  name_00._M_str = "ra";
  name_00._M_len = 2;
  pFVar4 = Descriptor::FindFieldByName(MVar5.descriptor,name_00);
  util::MessageDifferencer::TreatAsSet(&local_1d0,pFVar4);
  this_00 = (RepeatedField<int> *)((long)pvVar2 + 0x18);
  value = 0;
  do {
    RepeatedField<int>::Add(this_00,value);
    RepeatedField<int>::Add((RepeatedField<int> *)((long)pvVar3 + 0x18),value);
    value = value + 1;
  } while (value != 1000);
  local_370[0] = (internal)
                 util::MessageDifferencer::Compare
                           (&local_1d0,(Message *)local_288,(Message *)local_340);
  local_368 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_370[0]) {
    testing::Message::Message((Message *)&local_378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_360,local_370,(AssertionResult *)0x122213d,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x98,local_360._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if (local_378._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_378._M_head_impl + 8))();
    }
    if (local_368 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_368,local_368);
    }
  }
  RepeatedField<int>::Add((RepeatedField<int> *)((long)pvVar3 + 0x18),0x3e9);
  bVar1 = util::MessageDifferencer::Compare(&local_1d0,(Message *)local_288,(Message *)local_340);
  local_370[0] = (internal)!bVar1;
  local_368 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_360,local_370,(AssertionResult *)0x122213d,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x9a,local_360._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if (local_378._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_378._M_head_impl + 8))();
    }
    if (local_368 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_368,local_368);
    }
  }
  RepeatedField<int>::Add(this_00,0x3e9);
  local_370[0] = (internal)
                 util::MessageDifferencer::Compare
                           (&local_1d0,(Message *)local_288,(Message *)local_340);
  local_368 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_370[0]) {
    testing::Message::Message((Message *)&local_378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_360,local_370,(AssertionResult *)0x122213d,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x9c,local_360._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if (local_378._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_378._M_head_impl + 8))();
    }
    if (local_368 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_368,local_368);
    }
  }
  RepeatedField<int>::Add(this_00,0x3ea);
  bVar1 = util::MessageDifferencer::Compare(&local_1d0,(Message *)local_288,(Message *)local_340);
  local_370[0] = (internal)!bVar1;
  local_368 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_360,local_370,(AssertionResult *)0x122213d,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x9e,local_360._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if (local_378._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_378._M_head_impl + 8))();
    }
    if (local_368 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_368,local_368);
    }
  }
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_340);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_288);
  util::MessageDifferencer::~MessageDifferencer(&local_1d0);
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldSetOptimizationTest) {
  util::MessageDifferencer differencer;
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;
  proto2_unittest::TestDiffMessage::Item* item1 = msg1.add_item();
  proto2_unittest::TestDiffMessage::Item* item2 = msg2.add_item();
  differencer.TreatAsSet(item1->GetDescriptor()->FindFieldByName("ra"));
  differencer.TreatAsSet(item2->GetDescriptor()->FindFieldByName("ra"));
  for (int i = 0; i < 1000; i++) {
    item1->add_ra(i);
    item2->add_ra(i);
  }
  EXPECT_TRUE(differencer.Compare(msg1, msg2));
  item2->add_ra(1001);
  EXPECT_FALSE(differencer.Compare(msg1, msg2));
  item1->add_ra(1001);
  EXPECT_TRUE(differencer.Compare(msg1, msg2));
  item1->add_ra(1002);
  EXPECT_FALSE(differencer.Compare(msg1, msg2));
}